

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuBilinearImageCompare.cpp
# Opt level: O2

deUint8 tcu::anon_unknown_0::interpolateChannel
                  (deUint32 fx1,deUint32 fy1,deUint8 p00,deUint8 p01,deUint8 p10,deUint8 p11)

{
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  undefined3 in_register_00000081;
  undefined7 in_register_00000089;
  
  return (deUint8)(((int)CONCAT71(in_register_00000009,p01) * fy1 +
                   (int)CONCAT71(in_register_00000011,p00) * (0x100 - fy1)) * (0x100 - fx1) +
                   ((int)CONCAT71(in_register_00000089,p11) * fy1 +
                   (0x100 - fy1) * CONCAT31(in_register_00000081,p10)) * fx1 + 0x8000 >> 0x10);
}

Assistant:

inline deUint8 interpolateChannel (deUint32 fx1, deUint32 fy1, deUint8 p00, deUint8 p01, deUint8 p10, deUint8 p11)
{
	const deUint32 fx0		= (1u<<NUM_SUBPIXEL_BITS) - fx1;
	const deUint32 fy0		= (1u<<NUM_SUBPIXEL_BITS) - fy1;
	const deUint32 half		= 1u<<(NUM_SUBPIXEL_BITS*2 - 1);
	const deUint32 sum		= fx0*fy0*p00 + fx1*fy0*p10 + fx0*fy1*p01 + fx1*fy1*p11;
	const deUint32 rounded	= (sum + half) >> (NUM_SUBPIXEL_BITS*2);

	DE_ASSERT(de::inRange<deUint32>(rounded, 0, 0xff));
	return (deUint8)rounded;
}